

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNABase::DataLoad(OPNABase *this,OPNABaseData *data)

{
  Chip *pCVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint8 *__dest;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  
  OPNBase::DataLoad(&this->super_OPNBase,&data->opnbase);
  *(undefined2 *)(this->pan + 4) = *(undefined2 *)(data->pan + 4);
  *(undefined4 *)this->pan = *(undefined4 *)data->pan;
  *(undefined4 *)(this->panvolume_l + 4) = *(undefined4 *)(data->panvolume_l + 4);
  *(undefined8 *)this->panvolume_l = *(undefined8 *)data->panvolume_l;
  *(undefined4 *)(this->panvolume_r + 4) = *(undefined4 *)(data->panvolume_r + 4);
  *(undefined8 *)this->panvolume_r = *(undefined8 *)data->panvolume_r;
  *(undefined8 *)this->fnum2 = *(undefined8 *)data->fnum2;
  this->fnum2[8] = data->fnum2[8];
  this->reg22 = data->reg22;
  uVar3 = data->stmask;
  uVar4 = data->statusnext;
  uVar5 = data->lfocount;
  this->reg29 = data->reg29;
  this->stmask = uVar3;
  this->statusnext = uVar4;
  this->lfocount = uVar5;
  this->lfodcount = data->lfodcount;
  *(undefined8 *)(this->fnum + 4) = *(undefined8 *)(data->fnum + 4);
  uVar2 = *(undefined8 *)(data->fnum + 2);
  *(undefined8 *)this->fnum = *(undefined8 *)data->fnum;
  *(undefined8 *)(this->fnum + 2) = uVar2;
  this->fnum3[2] = data->fnum3[2];
  *(undefined8 *)this->fnum3 = *(undefined8 *)data->fnum3;
  if (data->is_adpcmbuf == true) {
    __dest = this->adpcmbuf;
    if (__dest == (uint8 *)0x0) {
      __dest = (uint8 *)operator_new__(0x40000);
      this->adpcmbuf = __dest;
    }
    memcpy(__dest,data->adpcmbuf,0x40000);
  }
  uVar3 = data->adpcmnotice;
  uVar4 = data->startaddr;
  uVar6 = data->stopaddr;
  this->adpcmmask = data->adpcmmask;
  this->adpcmnotice = uVar3;
  this->startaddr = uVar4;
  this->stopaddr = uVar6;
  uVar3 = data->limitaddr;
  iVar7 = data->adpcmlevel;
  iVar8 = data->adpcmvolume;
  this->memaddr = data->memaddr;
  this->limitaddr = uVar3;
  this->adpcmlevel = iVar7;
  this->adpcmvolume = iVar8;
  uVar3 = data->deltan;
  iVar7 = data->adplc;
  iVar8 = data->adpld;
  this->adpcmvol = data->adpcmvol;
  this->deltan = uVar3;
  this->adplc = iVar7;
  this->adpld = iVar8;
  iVar7 = data->adpcmx;
  iVar8 = data->adpcmd;
  iVar9 = data->adpcmout;
  this->adplbase = data->adplbase;
  this->adpcmx = iVar7;
  this->adpcmd = iVar8;
  this->adpcmout = iVar9;
  iVar7 = data->apout1;
  this->apout0 = data->apout0;
  this->apout1 = iVar7;
  this->adpcmreadbuf = data->adpcmreadbuf;
  this->adpcmplay = data->adpcmplay;
  this->granuality = data->granuality;
  this->control1 = data->control1;
  this->control2 = data->control2;
  *(undefined8 *)this->adpcmreg = *(undefined8 *)data->adpcmreg;
  this->rhythmmask_ = data->rhythmmask_;
  pCVar1 = &(this->super_OPNBase).chip;
  puVar12 = &this->field_0x2e0;
  lVar11 = 0;
  do {
    Channel4::DataLoad((Channel4 *)(this->adpcmreg + lVar11 * 0x2e0 + 0xf),data->ch + lVar11);
    *(Chip **)(this->adpcmreg + lVar11 * 0x2e0 + 0x67) = pCVar1;
    lVar10 = 0;
    do {
      *(Chip **)(puVar12 + lVar10) = pCVar1;
      lVar10 = lVar10 + 0xa0;
    } while (lVar10 != 0x280);
    lVar11 = lVar11 + 1;
    puVar12 = puVar12 + 0x2e0;
  } while (lVar11 != 6);
  return;
}

Assistant:

void OPNABase::DataLoad(struct OPNABaseData* data) {
	OPNBase::DataLoad(&data->opnbase);
	memcpy(pan, data->pan, 6);
	memcpy(panvolume_l, data->panvolume_l, sizeof(uint16) * 6);
	memcpy(panvolume_r, data->panvolume_r, sizeof(uint16) * 6);
	memcpy(fnum2, data->fnum2, 9);
	reg22 = data->reg22;
	reg29 = data->reg29;
	stmask = data->stmask;
	statusnext = data->statusnext;
	lfocount = data->lfocount;
	lfodcount = data->lfodcount;
	memcpy(fnum, data->fnum, sizeof(uint) * 6);
	memcpy(fnum3, data->fnum3, sizeof(uint) * 3);
	if(data->is_adpcmbuf) {
		if(!adpcmbuf)
			adpcmbuf = new uint8[0x40000];
		memcpy(adpcmbuf, data->adpcmbuf, 0x40000);
	}
	adpcmmask = data->adpcmmask;
	adpcmnotice = data->adpcmnotice;
	startaddr = data->startaddr;
	stopaddr = data->stopaddr;
	memaddr = data->memaddr;
	limitaddr = data->limitaddr;
	adpcmlevel = data->adpcmlevel;
	adpcmvolume = data->adpcmvolume;
	adpcmvol = data->adpcmvol;
	deltan = data->deltan;
	adplc = data->adplc;
	adpld = data->adpld;
	adplbase = data->adplbase;
	adpcmx = data->adpcmx;
	adpcmd = data->adpcmd;
	adpcmout = data->adpcmout;
	apout0 = data->apout0;
	apout1 = data->apout1;
	adpcmreadbuf = data->adpcmreadbuf;
	adpcmplay = data->adpcmplay;
	granuality = data->granuality;
	control1 = data->control1;
	control2 = data->control2;
	memcpy(adpcmreg, data->adpcmreg, 8);
	rhythmmask_ = data->rhythmmask_;
	for(int i = 0; i < 6; i++) {
		ch[i].DataLoad(&data->ch[i]);
		ch[i].SetChip(&chip);
	}
}